

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void __thiscall
hbm::streaming::Controller::unsubscribe(Controller *this,signalReferences_t *signalReferences)

{
  bool bVar1;
  Value *pVVar2;
  char *in_RDI;
  const_iterator iter;
  Value content;
  Value *in_stack_00000308;
  Controller *in_stack_00000310;
  undefined4 in_stack_fffffffffffffeb8;
  UInt in_stack_fffffffffffffebc;
  Value *in_stack_fffffffffffffec0;
  Value *in_stack_fffffffffffffec8;
  Value *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  Value *in_stack_fffffffffffffef0;
  Value *in_stack_ffffffffffffff08;
  Value *in_stack_ffffffffffffff10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  string local_b8 [184];
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffed0);
  if (!bVar1) {
    Json::Value::Value(in_stack_fffffffffffffed0,
                       (ValueType)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    Json::Value::Value(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    Json::Value::operator[](in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    Json::Value::operator=
              (in_stack_fffffffffffffec0,
               (Value *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    Json::Value::~Value(in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffee8,in_RDI);
    Json::Value::Value(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    pVVar2 = Json::Value::operator[](in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    Json::Value::operator=
              (in_stack_fffffffffffffec0,
               (Value *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    Json::Value::~Value(in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_b8);
    local_c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffec0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (!bVar1) break;
      in_stack_fffffffffffffec8 = Json::Value::operator[](pVVar2,(char *)in_stack_fffffffffffffec8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_c0);
      Json::Value::Value(pVVar2,(string *)in_stack_fffffffffffffec8);
      Json::Value::append(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      Json::Value::~Value(in_stack_fffffffffffffef0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c0);
    }
    s_id = s_id + 1;
    Json::Value::Value(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    pVVar2 = Json::Value::operator[](pVVar2,(char *)in_stack_fffffffffffffec8);
    Json::Value::operator=
              (pVVar2,(Value *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    Json::Value::~Value(in_stack_fffffffffffffef0);
    execute(in_stack_00000310,in_stack_00000308);
    Json::Value::~Value(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void Controller::unsubscribe(const signalReferences_t &signalReferences)
		{
			if(signalReferences.empty()) {
				return;
			}
			Json::Value content;
			content[JSONRPC] = "2.0";
			content[METHOD] = m_streamId +".unsubscribe";
			for(signalReferences_t::const_iterator iter = signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
				content[PARAMS].append(*iter);
			}
			content["id"] = ++s_id;

			execute(content);
		}